

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCallback.h
# Opt level: O2

NativeCallback * __thiscall
flow::NativeCallback::param<std::__cxx11::string>(NativeCallback *this,string *name)

{
  _Variadic_union<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
  local_70;
  undefined1 local_20;
  
  local_70._0_4_ = 3;
  std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::
  emplace_back<flow::LiteralType>(&(this->signature_).args_,(LiteralType *)&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->names_,name);
  local_20 = 0;
  std::
  vector<std::variant<std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>,std::allocator<std::variant<std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>>>
  ::
  emplace_back<std::variant<std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>>
            ((vector<std::variant<std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>,std::allocator<std::variant<std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>>>
              *)&this->defaults_,
             (variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
              *)&local_70);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
                       *)&local_70);
  return this;
}

Assistant:

inline NativeCallback& NativeCallback::param<FlowString>(
    const std::string& name) {
  signature_.args().push_back(LiteralType::String);
  names_.push_back(name);
  defaults_.push_back(std::monostate{});

  return *this;
}